

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_string.h
# Opt level: O0

long __thiscall ST::string::to_long(string *this,conversion_result *result,int base)

{
  long lVar1;
  bool bVar2;
  char *pcVar3;
  string *psVar4;
  size_t sVar5;
  long value;
  char *endp;
  conversion_result *pcStack_20;
  int base_local;
  conversion_result *result_local;
  string *this_local;
  
  endp._4_4_ = base;
  pcStack_20 = result;
  result_local = (conversion_result *)this;
  bVar2 = empty(this);
  if (bVar2) {
    pcStack_20->m_flags = 2;
    this_local = (string *)0x0;
  }
  else {
    pcVar3 = c_str(this);
    psVar4 = (string *)strtol(pcVar3,(char **)&value,endp._4_4_);
    lVar1 = value;
    pcStack_20->m_flags = 0;
    pcVar3 = c_str(this);
    if ((char *)lVar1 != pcVar3) {
      pcStack_20->m_flags = pcStack_20->m_flags | 1;
    }
    pcVar3 = c_str(this);
    sVar5 = size(this);
    this_local = psVar4;
    if ((char *)value == pcVar3 + sVar5) {
      pcStack_20->m_flags = pcStack_20->m_flags | 2;
    }
  }
  return (long)this_local;
}

Assistant:

ST_NODISCARD
        long to_long(conversion_result &result, int base = 0) const noexcept
        {
            if (empty()) {
                result.m_flags = ST::conversion_result::result_full_match;
                return 0;
            }

            char *endp;
            long value = strtol(c_str(), &endp, base);
            result.m_flags = 0;
            if (endp != c_str())
                result.m_flags |= ST::conversion_result::result_ok;
            if (endp == c_str() + size())
                result.m_flags |= ST::conversion_result::result_full_match;
            return value;
        }